

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,QVariant>::emplace<QVariant_const&>
          (QHash<QString,QVariant> *this,QString *key,QVariant *args)

{
  PrivateShared *pPVar1;
  long in_FS_OFFSET;
  piter pVar2;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = *(PrivateShared **)this;
  if (pPVar1 == (PrivateShared *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
LAB_0019e15a:
    QHash<QString,_QVariant>::detach((QHash<QString,_QVariant> *)this);
    pVar2 = (piter)emplace_helper<QVariant_const&>(this,key,args);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_48.shared);
  }
  else {
    if (1 < *(uint *)pPVar1) {
      local_48.shared = pPVar1;
      if (*(uint *)pPVar1 != 0xffffffff) {
        LOCK();
        *(uint *)pPVar1 = *(uint *)pPVar1 + 1;
        UNLOCK();
      }
      goto LAB_0019e15a;
    }
    if (*(ulong *)(pPVar1 + 8) < *(ulong *)(pPVar1 + 0x10) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QVariant_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0019e1cc;
    }
    QVariant::QVariant((QVariant *)&local_48,args);
    pVar2 = (piter)QHash<QString,_QVariant>::emplace_helper<QVariant>
                             ((QHash<QString,_QVariant> *)this,key,(QVariant *)&local_48);
    QVariant::~QVariant((QVariant *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_0019e1cc:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }